

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O0

void other_find_moves(void)

{
  std::swap<char*>(&rack,&my_rack);
  std::swap<int>(&rack_size,&my_rack_size);
  find_moves();
  std::swap<int>(&rack_size,&my_rack_size);
  std::swap<char*>(&rack,&my_rack);
  return;
}

Assistant:

void other_find_moves() {
    std::swap(rack, my_rack);
    std::swap(rack_size, my_rack_size);
    find_moves();
    std::swap(rack_size, my_rack_size);
    std::swap(rack, my_rack);
}